

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O3

int AF_A_LeafCheck(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  double dVar2;
  double dVar3;
  VM_UBYTE VVar4;
  undefined8 *puVar5;
  AActor *pAVar6;
  PClass *pPVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  PClass *pPVar10;
  AActor *pAVar11;
  AActor *this;
  VMValue *pVVar12;
  char *__assertion;
  bool bVar13;
  bool bVar14;
  DAngle local_38;
  DAngle local_30;
  
  pPVar7 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e322a;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this == (AActor *)0x0) {
LAB_005e2fd6:
        this = (AActor *)0x0;
        pVVar12 = param;
        uVar9 = numparam;
      }
      else {
        pPVar10 = (this->super_DThinker).super_DObject.Class;
        if (pPVar10 == (PClass *)0x0) {
          iVar8 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
          pPVar10 = (PClass *)CONCAT44(extraout_var,iVar8);
          (this->super_DThinker).super_DObject.Class = pPVar10;
        }
        bVar13 = pPVar10 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar13;
        bVar14 = pPVar10 == pPVar7;
        if (!bVar14 && !bVar13) {
          do {
            pPVar10 = pPVar10->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar10 != (PClass *)0x0);
            if (pPVar10 == pPVar7) break;
          } while (pPVar10 != (PClass *)0x0);
        }
        pVVar12 = (VMValue *)(ulong)(bVar14 || bVar13);
        uVar9 = (uint)bVar13;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005e322a;
        }
      }
      pPVar7 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005e3096;
      VVar4 = param[1].field_0.field_3.Type;
      if (VVar4 != 0xff) {
        if (VVar4 != '\x03') goto LAB_005e321a;
        puVar5 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar5 != (undefined8 *)0x0) {
            pPVar10 = (PClass *)puVar5[1];
            if (pPVar10 == (PClass *)0x0) {
              pPVar10 = (PClass *)(**(code **)*puVar5)(puVar5,pVVar12,uVar9,ret);
              puVar5[1] = pPVar10;
            }
            bVar13 = pPVar10 != (PClass *)0x0;
            if (pPVar10 != pPVar7 && bVar13) {
              do {
                pPVar10 = pPVar10->ParentClass;
                bVar13 = pPVar10 != (PClass *)0x0;
                if (pPVar10 == pPVar7) break;
              } while (pPVar10 != (PClass *)0x0);
            }
            if (!bVar13) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005e322a;
            }
          }
        }
        else if (puVar5 != (undefined8 *)0x0) goto LAB_005e321a;
      }
      if (((numparam < 3) || (VVar4 = param[2].field_0.field_3.Type, VVar4 == 0xff)) ||
         ((VVar4 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005e3096:
        iVar8 = this->special1;
        this->special1 = iVar8 + 1;
        if (iVar8 < 0x13) {
          pAVar6 = (this->target).field_0.p;
          pAVar11 = this;
          if ((pAVar6 != (AActor *)0x0) &&
             (pAVar11 = pAVar6, ((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (this->target).field_0.p = (AActor *)0x0;
            pAVar11 = this;
          }
          dVar2 = (pAVar11->Angles).Yaw.Degrees;
          uVar9 = FRandom::GenRand32(&pr_leafcheck);
          if ((uVar9 & 0xff) < 0x41) {
            AActor::SetState(this,this->SpawnState + 7,false);
            uVar9 = FRandom::GenRand32(&pr_leafcheck);
            (this->Vel).Z = (double)(uVar9 & 0xff) * 0.0078125 + 1.0;
            local_38.Degrees = dVar2;
            uVar9 = FRandom::GenRand32(&pr_leafcheck);
            AActor::Thrust(this,&local_38,(double)(uVar9 & 0xff) * 0.0078125 + 2.0);
            pbVar1 = (byte *)((long)&(this->flags).Value + 2);
            *pbVar1 = *pbVar1 | 1;
          }
          else {
            dVar3 = (this->Vel).X;
            if ((((dVar3 == 0.0) && (!NAN(dVar3))) && (dVar3 = (this->Vel).Y, dVar3 == 0.0)) &&
               (!NAN(dVar3))) {
              local_30.Degrees = dVar2;
              uVar9 = FRandom::GenRand32(&pr_leafcheck);
              AActor::Thrust(this,&local_30,(double)(uVar9 & 0xff) * 0.0078125 + 1.0);
            }
          }
        }
        else {
          AActor::SetState(this,(FState *)0x0,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005e322a;
    }
    if (this == (AActor *)0x0) goto LAB_005e2fd6;
  }
LAB_005e321a:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005e322a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0x102,"int AF_A_LeafCheck(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LeafCheck)
{
	PARAM_ACTION_PROLOGUE;

	self->special1++;
	if (self->special1 >= 20)
	{
		self->SetState (NULL);
		return 0;
	}
	DAngle ang = self->target ? self->target->Angles.Yaw : self->Angles.Yaw;
	if (pr_leafcheck() > 64)
	{
		if (self->Vel.X == 0 && self->Vel.Y == 0)
		{
			self->Thrust(ang, pr_leafcheck() / 128. + 1);
		}
		return 0;
	}
	self->SetState (self->SpawnState + 7);
	self->Vel.Z = pr_leafcheck() / 128. + 1;
	self->Thrust(ang, pr_leafcheck() / 128. + 2);
	self->flags |= MF_MISSILE;
	return 0;
}